

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall slang::parsing::Lexer::scanWhitespace(Lexer *this)

{
  char cVar1;
  int iVar2;
  Lexer *in_RDI;
  bool done;
  undefined7 in_stack_fffffffffffffff0;
  byte bVar3;
  
  bVar3 = 0;
  while (((bVar3 ^ 0xff) & 1) != 0) {
    cVar1 = peek(in_RDI);
    iVar2 = (int)cVar1;
    if (((iVar2 == 9) || (iVar2 - 0xbU < 2)) || (iVar2 == 0x20)) {
      advance(in_RDI);
    }
    else {
      bVar3 = 1;
    }
  }
  addTrivia((Lexer *)CONCAT17(bVar3,in_stack_fffffffffffffff0),(TriviaKind)((ulong)in_RDI >> 0x38));
  return;
}

Assistant:

void Lexer::scanWhitespace() {
    bool done = false;
    while (!done) {
        switch (peek()) {
            case ' ':
            case '\t':
            case '\v':
            case '\f':
                advance();
                break;
            default:
                done = true;
                break;
        }
    }
    addTrivia(TriviaKind::Whitespace);
}